

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O2

void testDWATable(string *param_1)

{
  value_type *ppLVar1;
  LutHeaderWorker *pLVar2;
  undefined8 uVar3;
  int *piVar4;
  void *pvVar5;
  ulong uVar6;
  char cVar7;
  imath_half_bits_t iVar8;
  uint uVar9;
  int iVar10;
  value_type *ppLVar11;
  Thread *this;
  pointer ppRVar12;
  char *func;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t i_1;
  LutHeaderWorker *this_00;
  value_type *in_RSI;
  size_t sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int i;
  long lVar17;
  size_t __n;
  size_t i_3;
  ulong uVar18;
  pointer __p;
  unsigned_short *puVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  unsigned_short usXdr;
  unsigned_short usNative;
  char *tmp;
  LutHeaderWorker *pLStack_20080;
  LutHeaderWorker *pLStack_20078;
  undefined1 auStack_20068 [16];
  long lStack_20050;
  long lStack_20048;
  long lStack_20040;
  unsigned_short toLinear [65536];
  
  puVar19 = toLinear;
  for (lVar17 = 1; puVar19 = puVar19 + 1, lVar17 != 0x10000; lVar17 = lVar17 + 1) {
    if ((~(uint)lVar17 & 0x7c00) == 0) {
      *puVar19 = 0;
    }
    else {
      fVar21 = *(float *)(_imath_half_to_float_table + lVar17 * 4);
      auStack_20068 = ZEXT416((uint)fVar21);
      fVar21 = ABS(fVar21);
      if (fVar21 <= 1.0) {
        fVar22 = 2.2;
      }
      else {
        fVar22 = fVar21 + -1.0;
        fVar21 = 9.025013;
      }
      fVar21 = powf(fVar21,fVar22);
      iVar8 = imath_float_to_half((float)(~-(uint)((float)auStack_20068._0_4_ < 0.0) & (uint)fVar21
                                         | (uint)-fVar21 & -(uint)((float)auStack_20068._0_4_ < 0.0)
                                         ));
      in_RSI = (value_type *)(ulong)iVar8;
      tmp = (char *)puVar19;
      Imf_3_4::Xdr::write<Imf_3_4::CharPtrIO,char*>(&tmp,iVar8);
    }
  }
  puts("test dwaCompressorToLinear[]");
  ppLVar11 = (value_type *)0x0;
  do {
    if (ppLVar11 == (value_type *)0x20000) goto LAB_00113877;
    puVar19 = (unsigned_short *)((long)toLinear + (long)ppLVar11);
    in_RSI = (value_type *)((long)ppLVar11 + 2);
    ppLVar1 = ppLVar11 + 0x32dea;
    ppLVar11 = in_RSI;
  } while (*puVar19 == *(unsigned_short *)ppLVar1);
  in_RSI = (value_type *)0x138;
  core_test_fail("toLinear[i] == internal_test_ns::dwaCompressorToLinear[i]",(char *)0x138,0x3172a8,
                 "");
LAB_00113877:
  this_00 = (LutHeaderWorker *)&DAT_00156cf8;
  for (lVar17 = 1; lVar17 != 0x10000; lVar17 = lVar17 + 1) {
    usXdr = (unsigned_short)lVar17;
    in_RSI = (value_type *)&usNative;
    tmp = (char *)&usXdr;
    Imf_3_4::Xdr::read<Imf_3_4::CharPtrIO,char_const*>(&tmp,&usNative);
    if ((~usNative & 0x7c00) == 0) {
      iVar8 = 0;
    }
    else {
      fVar21 = *(float *)(_imath_half_to_float_table + (ulong)usNative * 4);
      fVar22 = ABS(fVar21);
      if (fVar22 <= 1.0) {
        auStack_20068._0_4_ = *(float *)(&DAT_00156cf8 + (ulong)(fVar21 < 0.0) * 4);
        fVar21 = powf(fVar22,0.45454544);
        fVar21 = (float)auStack_20068._0_4_ * fVar21;
      }
      else {
        auStack_20068._0_8_ = (double)*(float *)(&DAT_00156cf8 + (ulong)(fVar21 < 0.0) * 4);
        fVar21 = logf(fVar22);
        fVar21 = (float)(((double)(fVar21 / 2.2) + 1.0) * (double)auStack_20068._0_8_);
      }
      iVar8 = imath_float_to_half(fVar21);
    }
    toLinear[lVar17] = iVar8;
  }
  puts("test dwaCompressorToNonlinear[]");
  ppLVar11 = (value_type *)0x0;
  do {
    if (ppLVar11 == (value_type *)0x20000) goto LAB_001139a7;
    puVar19 = (unsigned_short *)((long)toLinear + (long)ppLVar11);
    in_RSI = (value_type *)((long)ppLVar11 + 2);
    ppLVar1 = ppLVar11 + 0x36dea;
    ppLVar11 = in_RSI;
  } while (*puVar19 == *(unsigned_short *)ppLVar1);
  in_RSI = (value_type *)0x16e;
  core_test_fail("toNonlinear[i] == internal_test_ns::dwaCompressorToNonlinear[i]",(char *)0x16e,
                 0x3172fc,"");
LAB_001139a7:
  cVar7 = IlmThread_3_4::supportsThreads();
  if (cVar7 == '\0') {
    uVar18 = 1;
  }
  else {
    uVar9 = std::thread::hardware_concurrency();
    uVar18 = 1;
    if (1 < (int)uVar9) {
      uVar18 = (ulong)uVar9;
    }
  }
  uVar6 = 0x10000 / uVar18;
  uVar20 = 0;
  while (uVar20 != uVar18) {
    if (uVar20 == uVar18 - 1) {
      this_00 = (LutHeaderWorker *)operator_new(0x30);
      anon_unknown.dwarf_2a55c::LutHeaderWorker::LutHeaderWorker
                (this_00,(uVar18 - 1) * uVar6,0x10000);
      in_RSI = (value_type *)&tmp;
      tmp = (char *)this_00;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back((vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   *)toLinear,in_RSI);
      uVar20 = uVar18;
    }
    else {
      this_00 = (LutHeaderWorker *)operator_new(0x30);
      sVar13 = uVar20 * uVar6;
      uVar20 = uVar20 + 1;
      anon_unknown.dwarf_2a55c::LutHeaderWorker::LutHeaderWorker(this_00,sVar13,uVar20 * uVar6);
      in_RSI = (value_type *)&tmp;
      tmp = (char *)this_00;
      std::
      vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
      ::push_back((vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                   *)toLinear,in_RSI);
    }
  }
  cVar7 = IlmThread_3_4::supportsThreads();
  if (cVar7 == '\0') {
    for (lVar17 = 0; lVar17 != 0; lVar17 = lVar17 + 1) {
      anon_unknown.dwarf_2a55c::LutHeaderWorker::run
                (*(LutHeaderWorker **)(lVar17 * 8),SUB81(in_RSI,0));
    }
  }
  else {
    tmp = (char *)0x0;
    pLStack_20080 = (LutHeaderWorker *)0x0;
    pLStack_20078 = (LutHeaderWorker *)0x0;
    lStack_20040 = 0;
    lStack_20050 = 0;
    this_00 = (LutHeaderWorker *)0x0;
    for (lVar17 = 0; pLVar2 = pLStack_20080, lStack_20050 != lVar17; lVar17 = lVar17 + 1) {
      auStack_20068._0_8_ = this_00;
      lStack_20048 = lVar17;
      this = (Thread *)operator_new(0x48);
      lVar17 = lStack_20048;
      uVar3 = *(undefined8 *)(lStack_20040 + lStack_20048 * 8);
      IlmThread_3_4::Thread::Thread(this);
      *(undefined ***)this = &PTR__Runner_00336a18;
      *(undefined8 *)(this + 0x10) = uVar3;
      this[0x18] = (Thread)(lVar17 == 0);
      IlmThread_3_4::Semaphore::Semaphore((Semaphore *)(this + 0x20),0);
      this_00 = (LutHeaderWorker *)auStack_20068._0_8_;
      IlmThread_3_4::Thread::start();
      if (pLVar2 == pLStack_20078) {
        __n = (long)pLVar2 - (long)this_00;
        if (__n == 0x7ffffffffffffff8) {
LAB_00113d96:
          tmp = (char *)this_00;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)__n >> 3);
        ppRVar12 = (pointer)0x1;
        if (pLVar2 != this_00) {
          ppRVar12 = __p;
        }
        uVar18 = (long)ppRVar12 + (long)__p;
        if (0xffffffffffffffe < uVar18) {
          uVar18 = 0xfffffffffffffff;
        }
        if (CARRY8((ulong)ppRVar12,(ulong)__p)) {
          uVar18 = 0xfffffffffffffff;
        }
        if (uVar18 == 0) {
          this_00 = (LutHeaderWorker *)0x0;
          sVar13 = extraout_RDX;
        }
        else {
          this_00 = (LutHeaderWorker *)operator_new(uVar18 * 8);
          sVar13 = extraout_RDX_00;
        }
        (&this_00->_lastCandidateCount)[(long)__p] = (size_t)this;
        uVar3 = auStack_20068._0_8_;
        if (0 < (long)__n) {
          memmove(this_00,(void *)auStack_20068._0_8_,__n);
          sVar13 = extraout_RDX_01;
        }
        pLVar2 = (LutHeaderWorker *)(__n + (long)this_00);
        std::
        _Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
        ::_M_deallocate((_Vector_base<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
                         *)uVar3,__p,sVar13);
        pLStack_20078 = (LutHeaderWorker *)(&this_00->_lastCandidateCount + uVar18);
        lVar17 = lStack_20048;
      }
      else {
        pLVar2->_lastCandidateCount = (size_t)this;
      }
      pLStack_20080 = (LutHeaderWorker *)&pLVar2->_startValue;
    }
    tmp = (char *)this_00;
    for (lVar17 = 0; lStack_20050 != lVar17; lVar17 = lVar17 + 1) {
      if ((long *)(&this_00->_lastCandidateCount)[lVar17] != (long *)0x0) {
        (**(code **)(*(long *)(&this_00->_lastCandidateCount)[lVar17] + 8))();
      }
    }
    std::
    vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
    ::~vector((vector<(anonymous_namespace)::LutHeaderWorker::Runner_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker::Runner_*>_>
               *)&tmp);
  }
  puts("test closestDataOffset[]");
  lVar14 = 0;
  func = (char *)0x0;
  lVar17 = 0;
  do {
    if (lVar17 == 0) {
      puts("test closestData[]");
      lVar17 = 0;
      func = "";
      lVar14 = 0;
      do {
        if (lVar14 == 0) {
          for (lVar17 = 0; lVar17 != 0; lVar17 = lVar17 + 1) {
            pvVar5 = *(void **)(lVar17 * 8);
            if (pvVar5 != (void *)0x0) {
              if (*(void **)((long)pvVar5 + 0x20) != (void *)0x0) {
                operator_delete__(*(void **)((long)pvVar5 + 0x20));
              }
              if (*(void **)((long)pvVar5 + 0x28) != (void *)0x0) {
                operator_delete__(*(void **)((long)pvVar5 + 0x28));
              }
            }
            operator_delete(pvVar5,0x30);
          }
          std::
          vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
          ::~vector((vector<(anonymous_namespace)::LutHeaderWorker_*,_std::allocator<(anonymous_namespace)::LutHeaderWorker_*>_>
                     *)toLinear);
          return;
        }
        lVar15 = *(long *)(*(long *)(lVar14 * 8) + 0x18);
        iVar10 = (int)lVar17;
        lVar17 = lVar15 + iVar10;
        for (lVar16 = 0; lVar15 != lVar16; lVar16 = lVar16 + 1) {
          if ((&internal_test_ns::closestData)[lVar16 + iVar10] !=
              *(short *)(*(long *)(*(long *)(lVar14 * 8) + 0x28) + lVar16 * 2)) goto LAB_00113d7e;
        }
        lVar14 = lVar14 + 1;
      } while( true );
    }
    piVar4 = *(int **)(lVar17 * 8);
    iVar10 = (int)lVar14;
    lVar15 = *(long *)(piVar4 + 4) - *(long *)(piVar4 + 2);
    lVar14 = (*(long *)(piVar4 + 4) + (long)iVar10) - *(long *)(piVar4 + 2);
    for (lVar16 = 0; lVar15 != lVar16; lVar16 = lVar16 + 1) {
      if (*(long *)(*(long *)(piVar4 + 8) + lVar16 * 8) + (long)(int)func !=
          (ulong)(uint)(&internal_test_ns::closestDataOffset)[lVar16 + iVar10]) {
        core_test_fail("internal_test_ns::closestDataOffset[offsetIdx] == workers[i]->offset ()[value] + offsetPrev"
                       ,(char *)0x1d8,0x31736f,func);
LAB_00113d7e:
        core_test_fail("internal_test_ns::closestData[elementIdx] == workers[i]->elements ()[element]"
                       ,(char *)0x1e8,0x31736f,func);
        goto LAB_00113d96;
      }
    }
    func = (char *)(ulong)(uint)((int)func +
                                *piVar4 + *(int *)(*(long *)(piVar4 + 8) + -8 + lVar15 * 8));
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

static void
testToLinear ()
{
    unsigned short toLinear[65536];

    toLinear[0] = 0;

    for (int i = 1; i < 65536; ++i)
    {
        half  h;
        float sign    = 1;
        float logBase = pow (2.7182818, 2.2);

        // map  NaN and inf to 0
        if ((i & 0x7c00) == 0x7c00)
        {
            toLinear[i] = 0;
            continue;
        }

        //
        // _toLinear - assume i is NATIVE, but our output needs
        //             to get flipped to XDR
        //
        h.setBits (i);
        sign = 1;
        if ((float) h < 0) { sign = -1; }

        if (fabs ((float) h) <= 1.0)
        {
            h = (half) (sign * pow ((float) fabs ((float) h), 2.2f));
        }
        else
        {
            h = (half) (sign * pow (logBase, (float) (fabs ((float) h) - 1.0)));
        }

        {
            char* tmp = (char*) (&toLinear[i]);

            Xdr::write<CharPtrIO> (tmp, h.bits ());
        }
    }

    printf ("test dwaCompressorToLinear[]\n");
    for (int i = 0; i < 65536; ++i)
        EXRCORE_TEST (
            toLinear[i] ==
            internal_test_ns::dwaCompressorToLinear[i]);
}